

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O3

void __thiscall
duckdb::LocalStorage::VerifyNewConstraint
          (LocalStorage *this,DataTable *parent,BoundConstraint *constraint)

{
  RowGroupCollection *this_00;
  optional_ptr<duckdb::LocalTableStorage,_true> storage;
  optional_ptr<duckdb::LocalTableStorage,_true> local_20;
  
  local_20 = LocalTableManager::GetStorage(&this->table_manager,parent);
  if (local_20.ptr != (LocalTableStorage *)0x0) {
    optional_ptr<duckdb::LocalTableStorage,_true>::CheckValid(&local_20);
    this_00 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&(local_20.ptr)->row_groups);
    RowGroupCollection::VerifyNewConstraint(this_00,parent,constraint);
  }
  return;
}

Assistant:

void LocalStorage::VerifyNewConstraint(DataTable &parent, const BoundConstraint &constraint) {
	auto storage = table_manager.GetStorage(parent);
	if (!storage) {
		return;
	}
	storage->row_groups->VerifyNewConstraint(parent, constraint);
}